

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

void Sim_UtilSimulate(Sim_Man_t *p,int fType)

{
  Abc_Obj_t *pAVar1;
  int i;
  int iVar2;
  Abc_Ntk_t *pNtk;
  
  iVar2 = 0;
  while( true ) {
    pNtk = p->pNtk;
    if (pNtk->vObjs->nSize <= iVar2) break;
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar2);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
      Sim_UtilSimulateNode(p,pAVar1,fType,fType,fType);
    }
    iVar2 = iVar2 + 1;
  }
  for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,iVar2);
    Sim_UtilSimulateNode(p,pAVar1,fType,fType,fType);
    pNtk = p->pNtk;
  }
  return;
}

Assistant:

void Sim_UtilSimulate( Sim_Man_t * p, int fType )
{
    Abc_Obj_t * pNode;
    int i;
    // simulate the internal nodes
    Abc_NtkForEachNode( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
    // assign simulation info of the CO nodes
    Abc_NtkForEachCo( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
}